

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,duckdb::uhugeint_t>
          (TryCast *this,string_t input,uhugeint_t *result,bool strict)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  uint64_t *puVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  idx_t pos;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  long lVar14;
  bool bVar15;
  IntegerCastData<short> local_c2;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  uint64_t *local_a8;
  ulong local_a0;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> local_98;
  undefined8 local_40;
  long local_38;
  
  local_a8 = input.value._8_8_;
  local_38 = input.value._0_8_;
  if ((uint)this == 0) {
    return false;
  }
  bVar3 = (byte)result;
  uVar11 = (ulong)this & 0xffffffff;
  lVar14 = input.value._0_8_;
  if ((uint)this < 0xd) {
    lVar14 = (long)&local_40 + 4;
  }
  uVar12 = 0;
  while ((bVar2 = *(byte *)(lVar14 + uVar12), bVar2 - 9 < 5 || (bVar2 == 0x20))) {
    uVar12 = uVar12 + 1;
    if (uVar11 == uVar12) {
      return false;
    }
  }
  local_98.decimal_intermediate.upper = 0;
  local_98.decimal_intermediate_digits = 0;
  local_98._74_6_ = 0;
  local_98.decimal_total_digits = 0;
  local_98._50_6_ = 0;
  local_98.decimal_intermediate.lower = 0;
  local_98.decimal.lower = 0;
  local_98.decimal.upper = 0;
  local_98.intermediate = 0;
  local_98.digits = '\0';
  local_98._25_7_ = 0;
  local_98.result.lower = 0;
  local_98.result.upper = 0;
  local_c0 = uVar11 - uVar12;
  local_40 = this;
  if (bVar2 != 0x2d) {
    if ((uVar11 - 1 != uVar12) && (bVar2 == 0x30)) {
      bVar2 = *(byte *)(lVar14 + 1 + uVar12);
      if (bVar2 < 0x62) {
        if ((bVar2 != 0x42) && (bVar2 != 0x58)) {
LAB_002824de:
          if (((byte)(bVar2 - 0x30) < 10 & bVar3) != 0) {
            return false;
          }
          uVar9 = 0;
          goto LAB_0028237a;
        }
      }
      else if ((bVar2 != 0x62) && (bVar2 != 0x78)) goto LAB_002824de;
      if ((uVar11 - uVar12) - 3 < 0xfffffffffffffffe) {
        return false;
      }
LAB_002824c0:
      HugeIntegerCastOperation::
      Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                (&local_98);
      return false;
    }
    if ((bVar2 == 0x2b & bVar3) != 0) {
      return false;
    }
    uVar9 = (ulong)(bVar2 == 0x2b);
LAB_0028237a:
    local_b0 = uVar9;
    if (local_c0 <= uVar9) goto LAB_002824c0;
    do {
      bVar2 = *(byte *)(uVar12 + uVar9 + lVar14);
      if (9 < (byte)(bVar2 - 0x30)) {
        if (bVar2 != 0x2e) goto LAB_002827dc;
        if (bVar3 != 0) {
          return false;
        }
        local_a0 = uVar9 + 1;
        uVar7 = uVar9;
        uVar10 = local_a0;
        if (local_c0 <= local_a0) goto LAB_00282897;
        goto LAB_002825f9;
      }
      bVar5 = HugeIntegerCastOperation::
              HandleDigit<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                        (&local_98,bVar2 - 0x30);
      if (!bVar5) {
        return false;
      }
      uVar10 = local_c0;
      if (~uVar9 + uVar11 == uVar12) break;
      if (*(char *)(uVar12 + 1 + uVar9 + lVar14) == '_' && bVar3 == 0) {
        if ((uVar11 - uVar9) - 2 == uVar12) {
          return false;
        }
        uVar10 = uVar9 + 2;
        if (9 < (byte)(*(char *)(uVar12 + lVar14 + uVar10) - 0x30U)) {
          return false;
        }
      }
      else {
        uVar10 = uVar9 + 1;
      }
      uVar9 = uVar10;
    } while (uVar10 < local_c0);
    goto LAB_00282682;
  }
  uVar9 = 1;
  while (uVar9 < local_c0) {
    lVar1 = lVar14 + uVar9;
    uVar9 = uVar9 + 1;
    if (*(char *)(uVar12 + lVar1) != '0') {
      return false;
    }
  }
  if (uVar11 - 1 == uVar12) {
    HugeIntegerCastOperation::
    Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
              (&local_98);
    return false;
  }
  uVar9 = 1;
  do {
    bVar2 = *(byte *)(uVar12 + uVar9 + lVar14);
    if (9 < (byte)(bVar2 - 0x30)) {
      uVar7 = uVar9;
      if (bVar2 != 0x2e) goto LAB_002826d4;
      if (bVar3 != 0) {
        return false;
      }
      uVar7 = uVar9 + 1;
      uVar10 = uVar7;
      local_b8 = uVar7;
      if (local_c0 <= uVar7) goto LAB_00282791;
      goto LAB_0028251b;
    }
    bVar5 = HugeIntegerCastOperation::
            HandleDigit<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                      (&local_98,bVar2 - 0x30);
    if (!bVar5) {
      return false;
    }
    uVar10 = local_c0;
    if (~uVar9 + uVar11 == uVar12) break;
    if (*(char *)(uVar12 + 1 + uVar9 + lVar14) == '_' && bVar3 == 0) {
      if ((uVar11 - uVar9) - 2 == uVar12) {
        return false;
      }
      uVar10 = uVar9 + 2;
      if (9 < (byte)(*(char *)(uVar12 + lVar14 + uVar10) - 0x30U)) {
        return false;
      }
    }
    else {
      uVar10 = uVar9 + 1;
    }
    uVar9 = uVar10;
  } while (uVar10 < local_c0);
  goto LAB_002825a5;
LAB_002825f9:
  local_b8 = uVar9;
  uVar9 = uVar10;
  bVar2 = *(byte *)(uVar12 + uVar9 + lVar14);
  if (9 < (byte)(bVar2 - 0x30)) {
    if (uVar9 <= local_a0 && local_b8 <= local_b0) {
      return false;
    }
LAB_002827dc:
    puVar4 = local_a8;
    uVar6 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar6 - 9) {
        return false;
      }
LAB_002827f2:
      uVar9 = uVar9 + 1;
      uVar10 = uVar9;
      if (uVar9 < local_c0) {
        do {
          bVar3 = *(byte *)(uVar12 + lVar14 + uVar9);
          if ((4 < bVar3 - 9) && (bVar3 != 0x20)) {
            return false;
          }
          uVar9 = uVar9 + 1;
          uVar10 = local_c0;
        } while (local_c0 != uVar9);
      }
      goto LAB_00282682;
    }
    if ((bVar2 != 0x65) && (uVar6 != 0x45)) {
      if (uVar6 != 0x20) {
        return false;
      }
      goto LAB_002827f2;
    }
    if (uVar9 == local_b0 || bVar3 != 0) {
      return false;
    }
    if (local_c0 <= uVar9 + 1) {
      return false;
    }
    local_c2.result = 0;
    pcVar8 = (char *)(uVar12 + lVar14 + uVar9 + 1);
    iVar13 = ~uVar12 + (uVar11 - uVar9);
    if (*pcVar8 == '-') {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar8,iVar13,&local_c2,false);
    }
    else {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar8,iVar13,&local_c2,false);
    }
    if (bVar5 == false) {
      return false;
    }
    bVar5 = HugeIntegerCastOperation::
            HandleExponent<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                      (&local_98,(int)local_c2.result);
    local_a8 = puVar4;
    goto joined_r0x002828e6;
  }
  bVar5 = HugeIntegerCastOperation::
          HandleDecimal<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false,true>
                    (&local_98,bVar2 - 0x30);
  if (!bVar5) {
    return false;
  }
  uVar7 = local_b8;
  uVar10 = local_c0;
  if (~uVar9 + uVar11 != uVar12) goto code_r0x00282634;
  goto LAB_00282897;
code_r0x00282634:
  if (*(char *)(uVar12 + 1 + uVar9 + lVar14) == '_') {
    if ((uVar11 - uVar9) - 2 == uVar12) {
      return false;
    }
    uVar10 = uVar9 + 2;
    if (9 < (byte)(*(char *)(uVar12 + lVar14 + uVar10) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar10 = uVar9 + 1;
  }
  uVar9 = local_b8;
  if (local_c0 <= uVar10) goto LAB_00282897;
  goto LAB_002825f9;
LAB_00282897:
  if ((uVar7 <= local_b0) && (uVar10 <= local_a0)) {
    return false;
  }
LAB_00282682:
  bVar5 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                    (&local_98);
  if (!bVar5) {
    return false;
  }
  bVar5 = uVar10 < local_b0;
  bVar15 = uVar10 == local_b0;
  goto LAB_002826a0;
LAB_0028251b:
  local_b0 = uVar7 + lVar14;
  bVar2 = *(byte *)(uVar12 + local_b0);
  if (9 < (byte)(bVar2 - 0x30)) {
    if (uVar7 <= local_b8 && uVar9 < 2) {
      return false;
    }
LAB_002826d4:
    uVar6 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar6 - 9) {
        return false;
      }
    }
    else {
      if ((bVar2 == 0x65) || (uVar6 == 0x45)) {
        if (uVar7 == 1 || bVar3 != 0) {
          return false;
        }
        if (local_c0 <= uVar7 + 1) {
          return false;
        }
        local_c2.result = 0;
        pcVar8 = (char *)(uVar12 + lVar14 + uVar7 + 1);
        iVar13 = ~uVar12 + (uVar11 - uVar7);
        if (*pcVar8 == '-') {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar8,iVar13,&local_c2,false);
        }
        else {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar8,iVar13,&local_c2,false);
        }
        if (bVar5 == false) {
          return false;
        }
        bVar5 = HugeIntegerCastOperation::
                HandleExponent<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                          (&local_98,(int)local_c2.result);
joined_r0x002828e6:
        if (!bVar5) {
          return false;
        }
        goto LAB_002826ab;
      }
      if (uVar6 != 0x20) {
        return false;
      }
    }
    uVar7 = uVar7 + 1;
    uVar10 = uVar7;
    if (uVar7 < local_c0) {
      do {
        bVar3 = *(byte *)(uVar12 + lVar14 + uVar7);
        if ((4 < bVar3 - 9) && (bVar3 != 0x20)) {
          return false;
        }
        uVar7 = uVar7 + 1;
        uVar10 = local_c0;
      } while (local_c0 != uVar7);
    }
    goto LAB_002825a5;
  }
  bVar5 = HugeIntegerCastOperation::
          HandleDecimal<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true,true>
                    (&local_98,bVar2 - 0x30);
  if (!bVar5) {
    return false;
  }
  uVar10 = local_c0;
  if (~uVar7 + uVar11 != uVar12) goto code_r0x00282557;
  goto LAB_00282791;
code_r0x00282557:
  if (*(char *)(uVar12 + 1 + local_b0) == '_') {
    if ((uVar11 - uVar7) - 2 == uVar12) {
      return false;
    }
    uVar7 = uVar7 + 2;
    if (9 < (byte)(*(char *)(uVar12 + lVar14 + uVar7) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar7 = uVar7 + 1;
  }
  uVar10 = uVar7;
  if (local_c0 <= uVar7) goto LAB_00282791;
  goto LAB_0028251b;
LAB_00282791:
  if ((uVar9 < 2) && (uVar10 <= local_b8)) {
    return false;
  }
LAB_002825a5:
  bVar5 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                    (&local_98);
  if (!bVar5) {
    return false;
  }
  bVar5 = uVar10 == 0;
  bVar15 = uVar10 == 1;
LAB_002826a0:
  if (bVar5 || bVar15) {
    return false;
  }
LAB_002826ab:
  *local_a8 = local_98.result.lower;
  local_a8[1] = local_98.result.upper;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, uhugeint_t &result, bool strict) {
	HugeIntCastData<uhugeint_t, Uhugeint, uint64_t> state {};
	if (!TryIntegerCast<HugeIntCastData<uhugeint_t, Uhugeint, uint64_t>, false, true, HugeIntegerCastOperation>(
	        input.GetData(), input.GetSize(), state, strict)) {
		return false;
	}
	result = state.result;
	return true;
}